

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::setFrontFaceCCW(GLEngine *this,bool newVal)

{
  if ((this->super_Engine).frontFaceCCW == newVal) {
    return;
  }
  (this->super_Engine).frontFaceCCW = newVal;
  (*glad_glFrontFace)(newVal | 0x900);
  return;
}

Assistant:

void GLEngine::setFrontFaceCCW(bool newVal) {
  if (newVal == frontFaceCCW) return;
  frontFaceCCW = newVal;
  if (frontFaceCCW) {
    glFrontFace(GL_CCW);
  } else {
    glFrontFace(GL_CW);
  }
}